

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O2

bool __thiscall crnlib::dds_comp::create_dds_tex(dds_comp *this,mipmapped_texture *dds_tex)

{
  color_quad<unsigned_char,_int> *pPixels;
  bool bVar1;
  uint uVar2;
  conversion_type conv_type;
  long lVar3;
  ulong uVar4;
  crn_comp_params *pcVar5;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar6;
  ulong uVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar11;
  uint *puVar12;
  vector<crnlib::vector<crnlib::mip_level_*>_> *this_00;
  uint level_index;
  ulong uVar13;
  uint level_index_1;
  uint uVar14;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_1298;
  mip_level *pMip;
  mipmapped_texture *local_1270;
  face_vec faces;
  undefined8 uStack_1250;
  vector<crnlib::color_quad<unsigned_char,_int>_> local_1248;
  image_u8 images [6] [16];
  
  lVar3 = 0x18;
  do {
    *(undefined8 *)((long)&uStack_1250 + lVar3) = 0;
    *(undefined8 *)((long)&local_1248.m_p + lVar3) = 0;
    *(undefined4 *)((long)&images[-1][0xf].m_pixel_buf.m_size + lVar3) = 0xf;
    *(undefined8 *)((long)&images[0][0].m_comp_flags + lVar3) = 0;
    *(undefined8 *)((long)&images[0][0].m_width + lVar3) = 0;
    *(undefined8 *)((long)&images[0][0].m_pitch + lVar3) = 0;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x1218);
  pcVar5 = this->m_pParams;
  lVar3 = 0x28;
  piVar11 = images[0];
  uVar4 = 0;
  uVar14 = 0;
  local_1270 = dds_tex;
  do {
    uVar7 = (ulong)pcVar5->m_faces;
    if (uVar7 <= uVar4) {
LAB_001535e2:
      puVar8 = &images[0][0].m_comp_flags;
      for (uVar10 = 0; uVar10 < pcVar5->m_faces; uVar10 = uVar10 + 1) {
        puVar12 = puVar8;
        for (uVar13 = 0; uVar13 < pcVar5->m_levels; uVar13 = uVar13 + 1) {
          *puVar12 = *puVar12 & 0xfffffff7 | uVar14 << 3;
          puVar12 = puVar12 + 0xc;
        }
        puVar8 = puVar8 + 0xc0;
      }
      conv_type = image_utils::get_image_conversion_type_from_crn_format(pcVar5->m_format);
      pcVar5 = this->m_pParams;
      if (conv_type == cConversion_Invalid) {
        uVar14 = pcVar5->m_faces;
      }
      else {
        local_1298 = images[0];
        uVar10 = 0;
        while( true ) {
          uVar14 = pcVar5->m_faces;
          if (uVar14 <= uVar10) break;
          piVar11 = local_1298;
          for (uVar13 = 0; uVar13 < pcVar5->m_levels; uVar13 = uVar13 + 1) {
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&faces,piVar11);
            image_utils::convert_image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&faces,conv_type);
            image<crnlib::color_quad<unsigned_char,_int>_>::swap
                      (piVar11,(image<crnlib::color_quad<unsigned_char,_int>_> *)&faces);
            vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&local_1248);
            pcVar5 = this->m_pParams;
            piVar11 = piVar11 + 1;
          }
          uVar10 = uVar10 + 1;
          local_1298 = local_1298 + 0x10;
        }
      }
      this_00 = &faces;
      vector<crnlib::vector<crnlib::mip_level_*>_>::vector(this_00,uVar14);
      pcVar5 = this->m_pParams;
      local_1298 = images[0];
      for (uVar10 = 0; uVar10 < pcVar5->m_faces; uVar10 = uVar10 + 1) {
        piVar11 = local_1298;
        for (uVar13 = 0; uVar13 < pcVar5->m_levels; uVar13 = uVar13 + 1) {
          pMip = crnlib_new<crnlib::mip_level>();
          piVar6 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                   crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                             ((crnlib *)this_00);
          image<crnlib::color_quad<unsigned_char,_int>_>::swap(piVar6,piVar11);
          mip_level::assign(pMip,piVar6,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
          this_00 = (vector<crnlib::vector<crnlib::mip_level_*>_> *)(faces.m_p + uVar10);
          vector<crnlib::mip_level_*>::push_back((vector<crnlib::mip_level_*> *)this_00,&pMip);
          pcVar5 = this->m_pParams;
          piVar11 = piVar11 + 1;
        }
        local_1298 = local_1298 + 0x10;
      }
      mipmapped_texture::assign(local_1270,&faces);
      vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&faces);
LAB_0015377b:
      lVar3 = 0x11f0;
      do {
        vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
                  ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
                   ((long)&images[0][0].m_width + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != -0x10);
      return uVar7 <= uVar4;
    }
    piVar6 = piVar11;
    for (uVar10 = 0; uVar10 < pcVar5->m_levels; uVar10 = uVar10 + 1) {
      pPixels = *(color_quad<unsigned_char,_int> **)
                 ((long)(pcVar5->m_pImages + -1) + 0x58 + uVar10 * 8 + lVar3);
      if (pPixels == (color_quad<unsigned_char,_int> *)0x0) {
        if (uVar7 <= uVar4) goto LAB_001535e2;
        goto LAB_0015377b;
      }
      uVar2 = pcVar5->m_height >> ((byte)uVar10 & 0x1f);
      uVar9 = pcVar5->m_width >> ((byte)uVar10 & 0x1f);
      image<crnlib::color_quad<unsigned_char,_int>_>::alias
                (piVar6,pPixels,uVar9 + (uVar9 == 0),uVar2 + (uVar2 == 0),0xffffffff,0xf);
      if (uVar14 == 0) {
        bVar1 = image_utils::has_alpha(piVar6);
        uVar14 = (uint)bVar1;
      }
      pcVar5 = this->m_pParams;
      piVar6 = piVar6 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x80;
    piVar11 = piVar11 + 0x10;
  } while( true );
}

Assistant:

bool dds_comp::create_dds_tex(mipmapped_texture& dds_tex) {
  image_u8 images[cCRNMaxFaces][cCRNMaxLevels];

  bool has_alpha = false;
  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
      const uint height = math::maximum(1U, m_pParams->m_height >> level_index);

      if (!m_pParams->m_pImages[face_index][level_index])
        return false;

      images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
      if (!has_alpha)
        has_alpha = image_utils::has_alpha(images[face_index][level_index]);
    }
  }

  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
      images[face_index][level_index].set_component_valid(3, has_alpha);

  image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
  if (conv_type != image_utils::cConversion_Invalid) {
    for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
      for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
        image_u8 cooked_image(images[face_index][level_index]);

        image_utils::convert_image(cooked_image, conv_type);

        images[face_index][level_index].swap(cooked_image);
      }
    }
  }

  face_vec faces(m_pParams->m_faces);

  for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++) {
    for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++) {
      mip_level* pMip = crnlib_new<mip_level>();

      image_u8* pImage = crnlib_new<image_u8>();
      pImage->swap(images[face_index][level_index]);
      pMip->assign(pImage);

      faces[face_index].push_back(pMip);
    }
  }

  dds_tex.assign(faces);
#ifdef CRNLIB_BUILD_DEBUG
  CRNLIB_ASSERT(dds_tex.check());
#endif

  return true;
}